

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetPreconditioner(void *arkode_mem,ARKLsPrecSetupFn psetup,ARKLsPrecSolveFn psolve)

{
  int iVar1;
  ARKLsMem in_RAX;
  int error_code;
  char *msgfmt;
  ARKLsMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x349;
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    error_code = -0x30;
    iVar1 = 0x352;
  }
  else {
    arkls_mem = in_RAX;
    iVar1 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeSetPreconditioner",&arkls_mem);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (arkls_mem->LS->ops->setpreconditioner ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      error_code = -3;
      iVar1 = 0x35e;
    }
    else {
      arkls_mem->pset = psetup;
      arkls_mem->psolve = psolve;
      if (psetup != (ARKLsPrecSetupFn)0x0) {
        psetup = arkLsPSetup;
      }
      if (psolve != (ARKLsPrecSolveFn)0x0) {
        psolve = arkLsPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner(arkls_mem->LS,arkode_mem,psetup,psolve);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      error_code = -0xc;
      iVar1 = 0x36f;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetPreconditioner",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetPreconditioner(void* arkode_mem, ARKLsPrecSetupFn psetup,
                            ARKLsPrecSolveFn psolve)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  SUNPSetupFn arkls_psetup;
  SUNPSolveFn arkls_psolve;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (arkls_mem->LS->ops->setpreconditioner == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "preconditioning");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines */
  arkls_mem->pset   = psetup;
  arkls_mem->psolve = psolve;

  /* notify linear solver to call ARKLs interface routines */
  arkls_psetup = (psetup == NULL) ? NULL : arkLsPSetup;
  arkls_psolve = (psolve == NULL) ? NULL : arkLsPSolve;
  retval = SUNLinSolSetPreconditioner(arkls_mem->LS, ark_mem, arkls_psetup,
                                      arkls_psolve);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetPreconditioner");
    return (ARKLS_SUNLS_FAIL);
  }

  return (ARKLS_SUCCESS);
}